

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O1

void __thiscall llvm::DWARFGdbIndex::dumpSymbolTable(DWARFGdbIndex *this,raw_ostream *OS)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  char *__n;
  int *piVar5;
  raw_ostream *this_00;
  ulong uVar6;
  ulong uVar7;
  void *__buf;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  format_object_base local_50;
  undefined8 local_40;
  char *local_38;
  
  local_40 = (ulong)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                    super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                    super_SmallVectorBase.Size;
  local_50.Fmt = "\n  Symbol table offset = 0x%x, size = %ld, filled slots:";
  local_50._vptr_format_object_base = (_func_int **)&PTR_home_01098010;
  local_38 = (char *)CONCAT44(local_38._4_4_,this->SymbolTableOffset);
  this_00 = raw_ostream::operator<<(OS,&local_50);
  __n = this_00->OutBufCur;
  if (__n < this_00->OutBufEnd) {
    this_00->OutBufCur = __n + 1;
    *__n = '\n';
  }
  else {
    raw_ostream::write(this_00,10,__buf,(size_t)__n);
  }
  uVar6 = (ulong)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                 super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar6 != 0) {
    piVar11 = (int *)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                     super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                     super_SmallVectorBase.BeginX;
    piVar1 = piVar11 + uVar6 * 2;
    iVar12 = -1;
    do {
      iVar12 = iVar12 + 1;
      if ((*piVar11 != 0) || (piVar11[1] != 0)) {
        local_50.Fmt = "    %d: Name offset = 0x%x, CU vector offset = 0x%x\n";
        local_50._vptr_format_object_base = (_func_int **)&PTR_home_010984e8;
        local_40._4_4_ = (undefined4)*(undefined8 *)piVar11;
        local_40._0_4_ = (undefined4)((ulong)*(undefined8 *)piVar11 >> 0x20);
        local_38 = (char *)CONCAT44(local_38._4_4_,iVar12);
        raw_ostream::operator<<(OS,&local_50);
        uVar7 = (ulong)((this->ConstantPoolOffset - this->StringPoolOffset) + *piVar11);
        uVar6 = (this->ConstantPoolStrings).Length;
        if (uVar6 < uVar7) {
          uVar7 = uVar6;
        }
        piVar5 = (int *)(this->ConstantPoolVectors).
                        super_SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_>
                        .
                        super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
                        .
                        super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                        .super_SmallVectorBase.BeginX;
        uVar3 = (this->ConstantPoolVectors).
                super_SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_>
                .
                super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
                .
                super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                .super_SmallVectorBase.Size;
        piVar2 = piVar5 + (ulong)uVar3 * 6;
        piVar8 = piVar5;
        if (3 < (ulong)uVar3) {
          iVar4 = piVar11[1];
          piVar8 = piVar5 + (ulong)(uVar3 >> 2) * 0x18;
          lVar10 = (ulong)(uVar3 >> 2) + 1;
          piVar9 = piVar5 + 0xc;
          do {
            if (piVar9[-0xc] == iVar4) {
              piVar9 = piVar9 + -0xc;
              goto LAB_00d8c75d;
            }
            if (piVar9[-6] == iVar4) {
              piVar9 = piVar9 + -6;
              goto LAB_00d8c75d;
            }
            if (*piVar9 == iVar4) goto LAB_00d8c75d;
            if (piVar9[6] == iVar4) {
              piVar9 = piVar9 + 6;
              goto LAB_00d8c75d;
            }
            lVar10 = lVar10 + -1;
            piVar9 = piVar9 + 0x18;
          } while (1 < lVar10);
        }
        lVar10 = ((long)piVar2 - (long)piVar8 >> 3) * -0x5555555555555555;
        if (lVar10 == 1) {
LAB_00d8c73b:
          piVar9 = piVar8;
          if (*piVar8 != piVar11[1]) {
            piVar9 = piVar2;
          }
        }
        else if (lVar10 == 2) {
LAB_00d8c6e5:
          piVar9 = piVar8;
          if (*piVar8 != piVar11[1]) {
            piVar8 = piVar8 + 6;
            goto LAB_00d8c73b;
          }
        }
        else {
          piVar9 = piVar2;
          if ((lVar10 == 3) && (piVar9 = piVar8, *piVar8 != piVar11[1])) {
            piVar8 = piVar8 + 6;
            goto LAB_00d8c6e5;
          }
        }
LAB_00d8c75d:
        if (piVar9 == piVar2) {
          __assert_fail("CuVector != ConstantPoolVectors.end() && \"Invalid symbol table\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFGdbIndex.cpp"
                        ,0x4f,"void llvm::DWARFGdbIndex::dumpSymbolTable(raw_ostream &) const");
        }
        local_38 = (this->ConstantPoolStrings).Data + uVar7;
        local_50.Fmt = "      String name: %s, CU vector index: %d\n";
        local_50._vptr_format_object_base = (_func_int **)&PTR_home_010989f8;
        local_40 = CONCAT44(local_40._4_4_,
                            (int)((ulong)((long)piVar9 - (long)piVar5) >> 3) * -0x55555555);
        raw_ostream::operator<<(OS,&local_50);
      }
      piVar11 = piVar11 + 2;
    } while (piVar11 != piVar1);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpSymbolTable(raw_ostream &OS) const {
  OS << format("\n  Symbol table offset = 0x%x, size = %" PRId64
               ", filled slots:",
               SymbolTableOffset, (uint64_t)SymbolTable.size())
     << '\n';
  uint32_t I = -1;
  for (const SymTableEntry &E : SymbolTable) {
    ++I;
    if (!E.NameOffset && !E.VecOffset)
      continue;

    OS << format("    %d: Name offset = 0x%x, CU vector offset = 0x%x\n", I,
                 E.NameOffset, E.VecOffset);

    StringRef Name = ConstantPoolStrings.substr(
        ConstantPoolOffset - StringPoolOffset + E.NameOffset);

    auto CuVector = std::find_if(
        ConstantPoolVectors.begin(), ConstantPoolVectors.end(),
        [&](const std::pair<uint32_t, SmallVector<uint32_t, 0>> &V) {
          return V.first == E.VecOffset;
        });
    assert(CuVector != ConstantPoolVectors.end() && "Invalid symbol table");
    uint32_t CuVectorId = CuVector - ConstantPoolVectors.begin();
    OS << format("      String name: %s, CU vector index: %d\n", Name.data(),
                 CuVectorId);
  }
}